

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::Buffer
          (Buffer<unsigned_char> *this,Buffer<unsigned_char> *that)

{
  size_t sVar1;
  uchar *puVar2;
  ulong __size;
  
  puVar2 = this->_local;
  this->_buffer = puVar2;
  this->_capacity = 0xc0;
  this->_size = 0;
  this->_local[0] = '\0';
  __size = that->_size;
  if (__size != 0) {
    sVar1 = 0xc0;
    if (0xc0 < __size) {
      puVar2 = (uchar *)malloc(__size);
      this->_buffer = puVar2;
      ensureValidPointer(this,puVar2);
      sVar1 = that->_size;
      puVar2 = this->_buffer;
      __size = sVar1;
    }
    this->_capacity = sVar1;
    memcpy(puVar2,that->_buffer,__size);
    this->_size = that->_size;
  }
  return;
}

Assistant:

Buffer(Buffer const& that) : Buffer() {
    if (that._size > 0) {
      if (that._size > sizeof(that._local)) {
        _buffer = static_cast<T*>(velocypack_malloc(checkOverflow(that._size)));
        ensureValidPointer(_buffer);
        _capacity = that._size;
      } else {
        VELOCYPACK_ASSERT(_buffer == &_local[0]);
        _capacity = sizeof(_local);
      }
      memcpy(_buffer, that._buffer, checkOverflow(that._size));
      _size = that._size;
    }
  }